

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  FTP *pFVar2;
  char *pcVar3;
  uint uVar4;
  CURLcode CVar5;
  
  pFVar2 = (FTP *)(*Curl_ccalloc)(1,0x20);
  CVar5 = CURLE_OUT_OF_MEMORY;
  if (pFVar2 != (FTP *)0x0) {
    pcVar3 = (data->set).str[10];
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      (conn->proto).ftpc.account = pcVar3;
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(pFVar2);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pcVar3 = (data->set).str[0xb];
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      (conn->proto).ftpc.alternative_to_user = pcVar3;
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)((conn->proto).ftpc.account);
        (conn->proto).ftpc.account = (char *)0x0;
        (*Curl_cfree)(pFVar2);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data->req).p.ftp = pFVar2;
    pcVar3 = (data->state).up.path + 1;
    pFVar2->path = pcVar3;
    pcVar3 = strstr(pcVar3,";type=");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strstr((conn->host).rawalloc,";type=");
    }
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
      cVar1 = Curl_raw_toupper(pcVar3[6]);
      uVar4 = *(uint *)&(data->state).field_0x74c;
      if (cVar1 == 'D') {
        uVar4 = uVar4 | 0x8000;
      }
      else if (cVar1 == 'A') {
        uVar4 = uVar4 | 0x4000;
      }
      else {
        uVar4 = uVar4 & 0xffffbfff;
      }
      *(uint *)&(data->state).field_0x74c = uVar4;
    }
    pFVar2->transfer = PPTRANSFER_BODY;
    pFVar2->downloadsize = 0;
    (conn->proto).ftpc.known_filesize = -1;
    (conn->proto).ftpc.use_ssl = (data->set).use_ssl;
    (conn->proto).ftpc.ccc = (data->set).ftp_ccc;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  char *type;
  struct FTP *ftp;
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  ftp = calloc(1, sizeof(struct FTP));
  if(!ftp)
    return CURLE_OUT_OF_MEMORY;

  /* clone connection related data that is FTP specific */
  if(data->set.str[STRING_FTP_ACCOUNT]) {
    ftpc->account = strdup(data->set.str[STRING_FTP_ACCOUNT]);
    if(!ftpc->account) {
      free(ftp);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]) {
    ftpc->alternative_to_user =
      strdup(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
    if(!ftpc->alternative_to_user) {
      Curl_safefree(ftpc->account);
      free(ftp);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  data->req.p.ftp = ftp;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->state.list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = PPTRANSFER_BODY;
  ftp->downloadsize = 0;
  ftpc->known_filesize = -1; /* unknown size for now */
  ftpc->use_ssl = data->set.use_ssl;
  ftpc->ccc = data->set.ftp_ccc;

  return result;
}